

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantValue.h
# Opt level: O1

void __thiscall
flow::
ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
::~ConstantValue(ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
                 *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_Constant).super_Value._vptr_Value = (_func_int **)&PTR__ConstantValue_0019efe8;
  pcVar2 = (this->value_)._M_dataplus._M_p;
  paVar1 = &(this->value_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  Value::~Value((Value *)this);
  operator_delete(this,0x68);
  return;
}

Assistant:

ConstantValue(const T& value, const std::string& name = "")
      : Constant(Ty, name), value_(value) {}